

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O1

size_t objc_aligned_size(char *type)

{
  size_t *unaff_RBX;
  size_t size;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  sizeof_type(type,(size_t *)&stack0xffffffffffffffd8);
  uVar2 = 0;
  alignof_type((char *)0x0,unaff_RBX);
  return (uVar1 >> 3) + (uVar1 >> 3) % (uVar2 >> 3);
}

Assistant:

OBJC_PUBLIC
size_t objc_aligned_size(const char *type)
{
	size_t size  = objc_sizeof_type(type);
	size_t align = objc_alignof_type(type);
	return size + (size % align);
}